

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.h
# Opt level: O1

void __thiscall LTAircraft::CalcCameraViewPos(LTAircraft *this)

{
  double dVar1;
  long lVar2;
  positionTy *ppVar3;
  positionTy *ppVar4;
  undefined1 local_38 [16];
  double local_28;
  double dStack_20;
  
  if ((pExtViewAc == this) && (dataRefs.bUseExternalCamera == 0)) {
    ppVar3 = &this->ppos;
    ppVar4 = &posExt;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      ppVar4->_lat = ppVar3->_lat;
      ppVar3 = (positionTy *)&ppVar3->_lon;
      ppVar4 = (positionTy *)&ppVar4->_lon;
    }
    local_38._8_8_ = (double)extOffs.x + this->pMdl->EXT_CAMERA_LON_OFS;
    local_38._0_8_ = (this->ppos)._head;
    local_28 = NAN;
    dStack_20 = NAN;
    positionTy::operator+=(&posExt,(vectorTy *)local_38);
    dVar1 = (double)extOffs.z + this->pMdl->EXT_CAMERA_LAT_OFS;
    local_38._8_4_ = SUB84(dVar1,0);
    local_38._0_8_ = (this->ppos)._head + 90.0;
    local_38._12_4_ = (int)((ulong)dVar1 >> 0x20);
    local_28 = NAN;
    dStack_20 = NAN;
    positionTy::operator+=(&posExt,(vectorTy *)local_38);
    posExt._alt = (double)extOffs.y + this->pMdl->EXT_CAMERA_VERT_OFS + posExt._alt;
    positionTy::WorldToLocal(&posExt);
  }
  return;
}

Assistant:

inline bool IsInCameraView() const { return pExtViewAc == this; }